

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InliningDecider.cpp
# Opt level: O0

bool __thiscall InliningDecider::InlineIntoInliner(InliningDecider *this,FunctionBody *inliner)

{
  code *pcVar1;
  bool bVar2;
  ProfileId PVar3;
  uint uVar4;
  LocalFunctionId LVar5;
  int iVar6;
  undefined4 *puVar7;
  undefined4 extraout_var;
  char16 *pcVar8;
  DynamicProfileInfo *this_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  wchar local_78 [4];
  char16 debugStringBuffer [42];
  FunctionBody *inliner_local;
  InliningDecider *this_local;
  
  unique0x1000046b = inliner;
  if (inliner == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InliningDecider.cpp"
                       ,0x2d,"(inliner)","inliner");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (this->jitMode != FullJit) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InliningDecider.cpp"
                       ,0x2e,"(this->jitMode == ExecutionMode::FullJit)",
                       "this->jitMode == ExecutionMode::FullJit");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)stack0xffffffffffffffe0);
  LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)stack0xffffffffffffffe0);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,InlinePhase,uVar4,LVar5);
  if (!bVar2) {
    uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)stack0xffffffffffffffe0);
    LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)stack0xffffffffffffffe0);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,GlobOptPhase,uVar4,LVar5);
    if (!bVar2) {
      bVar2 = Js::FunctionBody::HasDynamicProfileInfo(stack0xffffffffffffffe0);
      if (!bVar2) {
        uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
        LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
        bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,InlinePhase,uVar4,LVar5);
        if (bVar2) {
          iVar6 = (*(stack0xffffffffffffffe0->super_ParseableFunctionInfo).super_FunctionProxy.
                    super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[7])();
          pcVar8 = Js::FunctionProxy::GetDebugNumberSet
                             ((FunctionProxy *)stack0xffffffffffffffe0,(wchar (*) [42])local_78);
          Output::Print(L"INLINING: Skip Inline: No dynamic profile info\tCaller: %s (%s)\n",
                        CONCAT44(extraout_var,iVar6),pcVar8);
          Output::Flush();
        }
        return false;
      }
      PVar3 = Js::FunctionBody::GetProfiledCallSiteCount(stack0xffffffffffffffe0);
      if (PVar3 == 0) {
        this_00 = Js::FunctionBody::GetAnyDynamicProfileInfo(stack0xffffffffffffffe0);
        bVar2 = Js::DynamicProfileInfo::HasLdFldCallSiteInfo(this_00);
        if (!bVar2) {
          if ((DAT_01ec73ca & 1) != 0) {
            uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
            LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
            bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,InlinePhase,uVar4,LVar5);
            if (bVar2) {
              iVar6 = (*(stack0xffffffffffffffe0->super_ParseableFunctionInfo).super_FunctionProxy.
                        super_FinalizableObject.super_IRecyclerVisitedObject.
                        _vptr_IRecyclerVisitedObject[7])();
              pcVar8 = Js::FunctionProxy::GetDebugNumberSet
                                 ((FunctionProxy *)stack0xffffffffffffffe0,(wchar (*) [42])local_78)
              ;
              Output::Print(L"INLINING: Skip Inline: Leaf function\tCaller: %s (%s)\n",
                            CONCAT44(extraout_var_00,iVar6),pcVar8);
              Output::Flush();
            }
          }
          return false;
        }
      }
      Js::FunctionBody::GetAnyDynamicProfileInfo(stack0xffffffffffffffe0);
      bVar2 = Js::DynamicProfileInfo::HasCallSiteInfo(stack0xffffffffffffffe0);
      if (!bVar2) {
        uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
        LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
        bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,InlinePhase,uVar4,LVar5);
        if (bVar2) {
          iVar6 = (*(stack0xffffffffffffffe0->super_ParseableFunctionInfo).super_FunctionProxy.
                    super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[7])();
          pcVar8 = Js::FunctionProxy::GetDebugNumberSet
                             ((FunctionProxy *)stack0xffffffffffffffe0,(wchar (*) [42])local_78);
          Output::Print(L"INLINING: Skip Inline: No call site info\tCaller: %s (#%d)\n",
                        CONCAT44(extraout_var_01,iVar6),pcVar8);
          Output::Flush();
        }
        return false;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool InliningDecider::InlineIntoInliner(Js::FunctionBody *const inliner) const
{
    Assert(inliner);
    Assert(this->jitMode == ExecutionMode::FullJit);

#if defined(DBG_DUMP) || defined(ENABLE_DEBUG_CONFIG_OPTIONS)
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif

    if (PHASE_OFF(Js::InlinePhase, inliner) ||
        PHASE_OFF(Js::GlobOptPhase, inliner))
    {
        return false;
    }

    if (!inliner->HasDynamicProfileInfo())
    {
        INLINE_TESTTRACE(_u("INLINING: Skip Inline: No dynamic profile info\tCaller: %s (%s)\n"), inliner->GetDisplayName(),
            inliner->GetDebugNumberSet(debugStringBuffer));
        return false;
    }

    if (inliner->GetProfiledCallSiteCount() == 0 && !inliner->GetAnyDynamicProfileInfo()->HasLdFldCallSiteInfo())
    {
        INLINE_TESTTRACE_VERBOSE(_u("INLINING: Skip Inline: Leaf function\tCaller: %s (%s)\n"), inliner->GetDisplayName(),
            inliner->GetDebugNumberSet(debugStringBuffer));
        // Nothing to do
        return false;
    }

    if (!inliner->GetAnyDynamicProfileInfo()->HasCallSiteInfo(inliner))
    {
        INLINE_TESTTRACE(_u("INLINING: Skip Inline: No call site info\tCaller: %s (#%d)\n"), inliner->GetDisplayName(),
            inliner->GetDebugNumberSet(debugStringBuffer));
        return false;
    }

    return true;
}